

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  ulong uVar1;
  pointer pcVar2;
  char *__s;
  CacheEntry *pCVar3;
  cmCacheManager *this_00;
  int iVar4;
  size_t sVar5;
  CacheEntry *this_01;
  mapped_type *this_02;
  long lVar6;
  string key;
  allocator<char> local_89;
  CacheEntry *local_88;
  string *local_80;
  cmCacheManager *local_78;
  string local_70;
  string local_50;
  
  if (e->Type == INTERNAL) {
    uVar1 = entryKey->_M_string_length;
    pcVar2 = (entryKey->_M_dataplus)._M_p;
    local_88 = e;
    local_80 = entryKey;
    local_78 = this;
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
      __s = *(char **)((long)PersistentProperties + lVar6);
      sVar5 = strlen(__s);
      if (((sVar5 + 1 < uVar1) && (pcVar2[~sVar5 + uVar1] == '-')) &&
         (iVar4 = strcmp(pcVar2 + ~sVar5 + uVar1 + 1,__s), iVar4 == 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)local_80);
        this_00 = local_78;
        this_01 = GetCacheEntry(local_78,&local_50);
        pCVar3 = local_88;
        if (this_01 == (CacheEntry *)0x0) {
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&this_00->Cache,&local_50);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_89);
          CacheEntry::SetProperty(this_02,&local_70,(pCVar3->Value)._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_89);
          CacheEntry::SetProperty(this_01,&local_70,(pCVar3->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(const std::string& entryKey,
                                       const CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char* p : cmCacheManager::PersistentProperties) {
    std::string::size_type plen = strlen(p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      if (auto* entry = this->GetCacheEntry(key)) {
        // Store this property on its entry.
        entry->SetProperty(p, e.Value.c_str());
      } else {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.SetProperty(p, e.Value.c_str());
      }
      return true;
    }
  }
  return false;
}